

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall CVmImageWriter::finish(CVmImageWriter *this)

{
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  
  end_block((CVmImageWriter *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  begin_block(this,in_stack_00000008,unaff_retaddr_00);
  end_block((CVmImageWriter *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  return;
}

Assistant:

void CVmImageWriter::finish()
{
    /* if there's a block open, close it */
    end_block();

    /* 
     *   write the EOF block - the block contains no data, so simply begin
     *   and end it 
     */
    begin_block("EOF ", TRUE);
    end_block();
}